

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O0

int ya_getopt_longopts(int argc,char **argv,char *arg,char *optstring,option *longopts,
                      int *longindex,int *long_only_flag)

{
  int iVar1;
  undefined8 *puVar2;
  size_t __n;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  long in_R8;
  int *in_R9;
  undefined4 *in_stack_00000008;
  char *hyphens;
  int idx;
  size_t namelen;
  option *opt;
  char *val;
  int local_60;
  int local_4c;
  char *local_38;
  
  local_38 = (char *)0x0;
  local_4c = 0;
  do {
    if (*(long *)(in_R8 + (long)local_4c * 0x20) == 0) {
      if (in_stack_00000008 == (undefined4 *)0x0) {
        ya_getopt_error(in_RCX,"%s: unrecognized option \'%s\'\n",*in_RSI,in_RSI[ya_optind]);
        ya_optind = ya_optind + 1;
      }
      else {
        *in_stack_00000008 = 1;
      }
      return 0x3f;
    }
    puVar2 = (undefined8 *)(in_R8 + (long)local_4c * 0x20);
    __n = strlen((char *)*puVar2);
    iVar1 = strncmp(in_RDX,(char *)*puVar2,__n);
    if (iVar1 == 0) {
      if (in_RDX[__n] == '\0') {
        if (*(int *)(puVar2 + 1) == 1) {
          ya_optind = ya_optind + 1;
          if (ya_optind == in_EDI) {
            ya_optarg = (char *)0x0;
            ya_optopt = *(int *)(puVar2 + 3);
            ya_getopt_error(in_RCX,"%s: option \'--%s\' requires an argument\n",*in_RSI,*puVar2);
            if (*in_RCX == ':') {
              return 0x3a;
            }
            return 0x3f;
          }
          local_38 = (char *)in_RSI[ya_optind];
        }
LAB_0010689b:
        ya_optarg = local_38;
        ya_optind = ya_optind + 1;
        if (puVar2[2] != 0) {
          *(undefined4 *)puVar2[2] = *(undefined4 *)(puVar2 + 3);
        }
        if (in_R9 != (int *)0x0) {
          *in_R9 = local_4c;
        }
        if (puVar2[2] == 0) {
          local_60 = *(int *)(puVar2 + 3);
        }
        else {
          local_60 = 0;
        }
        return local_60;
      }
      if (in_RDX[__n] == '=') {
        if (*(int *)(puVar2 + 1) == 0) {
          pcVar3 = "-";
          if (*(char *)(in_RSI[ya_optind] + 1) == '-') {
            pcVar3 = "--";
          }
          ya_optind = ya_optind + 1;
          ya_optarg = (char *)0x0;
          ya_optopt = *(int *)(puVar2 + 3);
          ya_getopt_error(in_RCX,"%s: option \'%s%s\' doesn\'t allow an argument\n",*in_RSI,pcVar3,
                          *puVar2);
          return 0x3f;
        }
        local_38 = in_RDX + __n + 1;
        goto LAB_0010689b;
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

static int ya_getopt_longopts(int argc, char * const argv[], char *arg, const char *optstring, const struct option *longopts, int *longindex, int *long_only_flag)
{
    char *val = NULL;
    const struct option *opt;
    size_t namelen;
    int idx;

    for (idx = 0; longopts[idx].name != NULL; idx++) {
        opt = &longopts[idx];
        namelen = strlen(opt->name);
        if (strncmp(arg, opt->name, namelen) == 0) {
            switch (arg[namelen]) {
            case '\0':
                switch (opt->has_arg) {
                case ya_required_argument:
                    ya_optind++;
                    if (ya_optind == argc) {
                        ya_optarg = NULL;
                        ya_optopt = opt->val;
                        ya_getopt_error(optstring, "%s: option '--%s' requires an argument\n", argv[0], opt->name);
                        if (optstring[0] == ':') {
                            return ':';
                        } else {
                            return '?';
                        }
                    }
                    val = argv[ya_optind];
                    break;
                }
                goto found;
            case '=':
                if (opt->has_arg == ya_no_argument) {
                    const char *hyphens = (argv[ya_optind][1] == '-') ? "--" : "-";

                    ya_optind++;
                    ya_optarg = NULL;
                    ya_optopt = opt->val;
                    ya_getopt_error(optstring, "%s: option '%s%s' doesn't allow an argument\n", argv[0], hyphens, opt->name);
                    return '?';
                }
                val = arg + namelen + 1;
                goto found;
            }
        }
    }
    if (long_only_flag) {
        *long_only_flag = 1;
    } else {
        ya_getopt_error(optstring, "%s: unrecognized option '%s'\n", argv[0], argv[ya_optind]);
        ya_optind++;
    }
    return '?';
found:
    ya_optarg = val;
    ya_optind++;
    if (opt->flag) {
        *opt->flag = opt->val;
    }
    if (longindex) {
        *longindex = idx;
    }
    return opt->flag ? 0 : opt->val;
}